

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O2

Gnuplot * __thiscall
Gnuplot::plotfile_xy(Gnuplot *this,string *filename,uint column_x,uint column_y,string *title)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  ostringstream local_1d0 [8];
  ostringstream cmdstr;
  string local_58;
  string *local_38;
  
  local_38 = title;
  file_available(this,filename);
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  pcVar3 = "replot ";
  if ((this->two_dim & 1U) == 0) {
    pcVar3 = "plot ";
  }
  if (this->nplots < 1) {
    pcVar3 = "plot ";
  }
  std::operator<<((ostream *)local_1d0,pcVar3);
  poVar2 = std::operator<<((ostream *)local_1d0,"\"");
  poVar2 = std::operator<<(poVar2,(string *)filename);
  poVar2 = std::operator<<(poVar2,"\" using ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,":");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<((ostream *)local_1d0," title \"");
  poVar2 = std::operator<<(poVar2,(string *)local_38);
  std::operator<<(poVar2,"\" ");
  bVar1 = std::operator==(&this->smooth,"");
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)local_1d0,"with ");
    std::operator<<(poVar2,(string *)&this->pstyle);
  }
  std::__cxx11::stringbuf::str();
  cmd(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::ostringstream::~ostringstream(local_1d0);
  return this;
}

Assistant:

Gnuplot& Gnuplot::plotfile_xy(const std::string &filename,
                              const unsigned int column_x,
                              const unsigned int column_y,
                              const std::string &title) {
  //
  // check if file exists
  //
  file_available(filename);

  std::ostringstream cmdstr;
  //
  // command to be sent to gnuplot
  //
  if (nplots > 0 && two_dim == true)
    cmdstr << "replot ";
  else
    cmdstr << "plot ";

  cmdstr << "\"" << filename << "\" using " << column_x << ":" << column_y;

//  if (title == "")
//   cmdstr << " notitle ";
//  else
  cmdstr << " title \"" << title << "\" ";

  if (smooth == "")
    cmdstr << "with " << pstyle;
//  else
//   cmdstr << "smooth " << smooth;

  //
  // Do the actual plot
  //
  cmd(cmdstr.str());
  return *this;
}